

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa.c
# Opt level: O2

mraa_boolean_t mraa_file_exist(char *filename)

{
  bool bVar1;
  glob_t results;
  glob_t local_58;
  
  local_58.gl_pathc = 0;
  glob(filename,0,(__errfunc *)0x0,&local_58);
  bVar1 = local_58.gl_pathc == 1;
  globfree(&local_58);
  return (mraa_boolean_t)bVar1;
}

Assistant:

mraa_boolean_t
mraa_file_exist(const char* filename)
{
    glob_t results;
    results.gl_pathc = 0;
    glob(filename, 0, NULL, &results);
    int file_found = results.gl_pathc == 1;
    globfree(&results);
    return file_found;
}